

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali_variant.c
# Opt level: O3

size_t cali_variant_get_size(cali_variant_t v)

{
  size_t sVar1;
  uint uVar2;
  
  sVar1 = 0;
  uVar2 = 0;
  if (((uint)v.type_and_size & 0xfe) < 10) {
    uVar2 = (uint)v.type_and_size;
  }
  switch(uVar2 & 0xff) {
  case 1:
  case 4:
    return v.type_and_size >> 0x20;
  case 2:
  case 3:
  case 5:
  case 6:
  case 9:
    sVar1 = 8;
    break;
  case 7:
    return 1;
  case 8:
    return 4;
  }
  return sVar1;
}

Assistant:

size_t cali_variant_get_size(cali_variant_t v)
{
    uint64_t       t    = _EXTRACT_TYPE(v.type_and_size);
    cali_attr_type type = (t <= CALI_MAXTYPE ? (cali_attr_type) t : CALI_TYPE_INV);

    switch (type) {
    case CALI_TYPE_INV:
        return 0;
    case CALI_TYPE_USR:
    case CALI_TYPE_STRING:
        return _EXTRACT_SIZE(v.type_and_size);
    case CALI_TYPE_INT:
    case CALI_TYPE_UINT:
    case CALI_TYPE_ADDR:
        return sizeof(uint64_t);
    case CALI_TYPE_DOUBLE:
        return sizeof(double);
    case CALI_TYPE_BOOL:
        return sizeof(bool);
    case CALI_TYPE_TYPE:
        return sizeof(cali_attr_type);
    case CALI_TYPE_PTR:
        return sizeof(void*);
    }

    return 0;
}